

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Vec_Vec_t *
Saig_ManCexMinCollectPhasePriority_(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis)

{
  int iVar1;
  Vec_Int_t *p;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Vec_t *vFramePPs;
  void **ppvVar6;
  void *pvVar7;
  Vec_Int_t *vRoots;
  int *piVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int local_48;
  
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      if (pVVar5->pArray[lVar10] != (void *)0x0) {
        *(undefined4 *)((long)pVVar5->pArray[lVar10] + 0x28) = 0xffffffff;
        pVVar5 = pAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  uVar11 = pCex->iFrame;
  uVar4 = uVar11 + 1;
  vFramePPs = (Vec_Vec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar11) {
    uVar9 = uVar4;
  }
  vFramePPs->nCap = uVar9;
  if (uVar9 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar9 << 3);
  }
  vFramePPs->pArray = ppvVar6;
  if (-1 < (int)uVar11) {
    uVar14 = 0;
    do {
      pvVar7 = calloc(1,0x10);
      ppvVar6[uVar14] = pvVar7;
      uVar14 = uVar14 + 1;
    } while (uVar4 != uVar14);
  }
  vFramePPs->nSize = uVar4;
  iVar12 = uVar4 * pCex->nPis;
  iVar3 = pCex->nRegs + iVar12;
  if (iVar3 < 0) {
LAB_00505a01:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  (pAig->pConst1->field_5).iData = iVar3 * 2 + 1;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar8 = (int *)malloc(4000);
  vRoots->pArray = piVar8;
  if (-1 < pCex->iFrame) {
    uVar4 = 0xffffffff;
    if (-1 < (int)uVar11) {
      uVar4 = uVar11;
    }
    uVar14 = 0;
    do {
      if (((long)vFrameCis->nSize <= (long)uVar14) || (uVar14 == uVar4 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      p = (Vec_Int_t *)ppvVar6[uVar14];
      if (p->nSize != 0) {
        __assert_fail("Vec_IntSize(vFramePPsOne) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x115,
                      "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority_(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                     );
      }
      pvVar7 = vFrameCis->pArray[uVar14];
      iVar3 = (int)uVar14;
      if (0 < *(int *)((long)pvVar7 + 4)) {
        local_48 = iVar3 + 1;
        lVar10 = 0;
        iVar15 = 0;
        do {
          pVVar5 = pAig->vObjs;
          if (pVVar5 == (Vec_Ptr_t *)0x0) {
            piVar8 = (int *)0x0;
          }
          else {
            uVar11 = *(uint *)(*(long *)((long)pvVar7 + 8) + lVar10 * 4);
            if (((int)uVar11 < 0) || (pVVar5->nSize <= (int)uVar11)) goto LAB_005059c3;
            piVar8 = (int *)pVVar5->pArray[uVar11];
          }
          if ((piVar8[6] & 7U) != 2) {
            __assert_fail("Aig_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                          ,0x118,
                          "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority_(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                         );
          }
          iVar1 = *piVar8;
          iVar13 = iVar1 - pAig->nTruePis;
          if (iVar1 < pAig->nTruePis) {
            iVar13 = pCex->nPis * local_48 - iVar15;
            if (iVar13 < 0) goto LAB_00505a01;
            iVar15 = iVar15 + 1;
            uVar11 = pCex->nPis * iVar3 + pCex->nRegs + iVar1;
            iVar13 = (uint)(((uint)(&pCex[1].iPo)[(int)uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0) +
                     iVar13 * 2;
          }
          else if (uVar14 == 0) {
            iVar13 = iVar13 + iVar12;
            if (iVar13 < 0) goto LAB_00505a01;
            iVar13 = iVar13 * 2;
          }
          else {
            uVar11 = iVar13 + pAig->nTruePos;
            if (((int)uVar11 < 0) || (pAig->vCos->nSize <= (int)uVar11)) goto LAB_005059c3;
            iVar13 = *(int *)((long)pAig->vCos->pArray[uVar11] + 0x28);
          }
          Vec_IntPush(p,iVar13);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar7 + 4));
      }
      Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,iVar3,vRoots);
      bVar2 = (long)uVar14 < (long)pCex->iFrame;
      uVar14 = uVar14 + 1;
    } while (bVar2);
    piVar8 = vRoots->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(vRoots);
  iVar3 = pCex->iPo;
  if ((-1 < (long)iVar3) && (iVar3 < pAig->vCos->nSize)) {
    uVar4 = *(uint *)((long)pAig->vCos->pArray[iVar3] + 0x28);
    if ((int)uVar4 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10d,"int Abc_LitIsCompl(int)");
    }
    if ((uVar4 & 1) == 0) {
      __assert_fail("Abc_LitIsCompl(pObj->iData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                    ,0x126,
                    "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority_(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                   );
    }
    return vFramePPs;
  }
LAB_005059c3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority_( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis )
{
    Vec_Vec_t * vFramePPs;
    Vec_Int_t * vRoots, * vFramePPsOne, * vFrameCisOne;
    Aig_Obj_t * pObj;
    int i, f, nPrioOffset;

    // initialize phase and priority
    Aig_ManForEachObj( pAig, pObj, i )
        pObj->iData = -1;

    // set the constant node to higher priority than the flops
    vFramePPs = Vec_VecStart( pCex->iFrame+1 );
    nPrioOffset = (pCex->iFrame + 1) * pCex->nPis;
    Aig_ManConst1(pAig)->iData = Abc_Var2Lit( nPrioOffset + pCex->nRegs, 1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        int nPiCount = 0;
        // fill in PP for the CIs
        vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
        vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
        assert( Vec_IntSize(vFramePPsOne) == 0 );
        Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
        {
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(pAig, pObj) )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( (f+1) * pCex->nPis - nPiCount++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj)) ) );
            else if ( f == 0 )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( nPrioOffset + Saig_ObjRegId(pAig, pObj), 0 ) );
            else
                Vec_IntPush( vFramePPsOne, Saig_ObjLoToLi(pAig, pObj)->iData );
        }
        // compute the PP info
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
    }
    Vec_IntFree( vRoots );
    // check the output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    assert( Abc_LitIsCompl(pObj->iData) );
    return vFramePPs;
}